

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool __thiscall
Fossilize::StateRecorder::get_hash_for_render_pass
          (StateRecorder *this,VkRenderPass render_pass,Hash *hash)

{
  bool bVar1;
  pointer ppVar2;
  _Node_iterator_base<std::pair<VkRenderPass_T_*const,_unsigned_long>,_false> local_38;
  _Node_iterator_base<std::pair<VkRenderPass_T_*const,_unsigned_long>,_false> local_30;
  iterator itr;
  Hash *hash_local;
  VkRenderPass render_pass_local;
  StateRecorder *this_local;
  
  if (render_pass == (VkRenderPass)0x0) {
    *hash = 0;
    this_local._7_1_ = true;
  }
  else {
    itr.super__Node_iterator_base<std::pair<VkRenderPass_T_*const,_unsigned_long>,_false>._M_cur =
         (_Node_iterator_base<std::pair<VkRenderPass_T_*const,_unsigned_long>,_false>)
         (_Node_iterator_base<std::pair<VkRenderPass_T_*const,_unsigned_long>,_false>)hash;
    hash_local = (Hash *)render_pass;
    render_pass_local = (VkRenderPass)this;
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<VkRenderPass_T_*,_unsigned_long,_std::hash<VkRenderPass_T_*>,_std::equal_to<VkRenderPass_T_*>,_std::allocator<std::pair<VkRenderPass_T_*const,_unsigned_long>_>_>
         ::find(&this->impl->render_pass_to_hash,(key_type *)&hash_local);
    local_38._M_cur =
         (__node_type *)
         std::
         end<std::unordered_map<VkRenderPass_T*,unsigned_long,std::hash<VkRenderPass_T*>,std::equal_to<VkRenderPass_T*>,std::allocator<std::pair<VkRenderPass_T*const,unsigned_long>>>>
                   (&this->impl->render_pass_to_hash);
    bVar1 = std::__detail::operator==(&local_30,&local_38);
    if (bVar1) {
      log_failed_hash<VkRenderPass_T*>("Render pass",(VkRenderPass_T *)hash_local);
      this_local._7_1_ = false;
    }
    else {
      ppVar2 = std::__detail::
               _Node_iterator<std::pair<VkRenderPass_T_*const,_unsigned_long>,_false,_false>::
               operator->((_Node_iterator<std::pair<VkRenderPass_T_*const,_unsigned_long>,_false,_false>
                           *)&local_30);
      *(unsigned_long *)
       itr.super__Node_iterator_base<std::pair<VkRenderPass_T_*const,_unsigned_long>,_false>._M_cur
           = ppVar2->second;
      this_local._7_1_ = true;
    }
  }
  return this_local._7_1_;
}

Assistant:

bool StateRecorder::get_hash_for_render_pass(VkRenderPass render_pass, Hash *hash) const
{
	if (render_pass == VK_NULL_HANDLE)
	{
		// Dynamic rendering.
		*hash = 0;
		return true;
	}

	auto itr = impl->render_pass_to_hash.find(render_pass);
	if (itr == end(impl->render_pass_to_hash))
	{
		log_failed_hash("Render pass", render_pass);
		return false;
	}
	else
	{
		*hash = itr->second;
		return true;
	}
}